

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.cpp
# Opt level: O1

void __thiscall Security::InsertNOPs(Security *this)

{
  undefined4 uVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  UINT_PTR UVar3;
  Instr *this_02;
  uint uVar4;
  bool bVar5;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,InsertNOPsPhase,sourceContextId,functionId);
  if (((bVar2) ||
      (bVar2 = Js::ConfigFlagsTable::IsEnabled
                         ((ConfigFlagsTable *)&Js::Configuration::Global,DebugFlag), bVar2)) ||
     (bVar2 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,BenchmarkFlag), bVar2)) {
    return;
  }
  this_02 = this->func->m_headInstr;
  do {
    uVar1 = DAT_015bbe84;
    UVar3 = Math::Rand();
    bVar2 = this_02 == (Instr *)0x0;
    if (!bVar2) {
      uVar4 = ~(-1 << ((byte)uVar1 & 0x1f)) & (uint)UVar3;
      do {
        this_02 = IR::Instr::GetNextRealInstr(this_02);
        bVar5 = uVar4 != 0;
        uVar4 = uVar4 - 1;
        bVar2 = this_02 == (Instr *)0x0;
        if (bVar2) break;
      } while (bVar5);
    }
    if (bVar2) {
      return;
    }
    UVar3 = Math::Rand();
    InsertSmallNOP(this_02,((uint)UVar3 & 3) + 1);
  } while( true );
}

Assistant:

void
Security::InsertNOPs()
{
    if (PHASE_OFF(Js::InsertNOPsPhase, this->func) || CONFIG_ISENABLED(Js::DebugFlag) || CONFIG_ISENABLED(Js::BenchmarkFlag))
    {
        return;
    }

    int count = 0;
    IR::Instr *instr = this->func->m_headInstr;

    while (true)
    {
        count = this->GetNextNOPInsertPoint();
        while (instr && count--)
        {
            instr = instr->GetNextRealInstr();
        }
        if (instr == nullptr)
        {
            break;
        }
        this->InsertNOPBefore(instr);
    };
}